

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::TestResult::RecordProperty
          (TestResult *this,string *xml_element,TestProperty *test_property)

{
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  __last;
  bool bVar1;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  _Var2;
  MutexLock lock;
  allocator local_69;
  GTestMutexLock local_68;
  string local_60 [32];
  TestPropertyKeyIs local_40;
  
  bVar1 = ValidateTestProperty(xml_element,test_property);
  if (bVar1) {
    local_68.mutex_ = (MutexBase *)this;
    internal::MutexBase::Lock((MutexBase *)this);
    _Var2._M_current =
         (this->test_properties_).
         super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->test_properties_).
         super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::__cxx11::string::string(local_60,(test_property->key_)._M_dataplus._M_p,&local_69);
    std::__cxx11::string::string((string *)&local_40,local_60);
    _Var2 = std::
            find_if<__gnu_cxx::__normal_iterator<testing::TestProperty*,std::vector<testing::TestProperty,std::allocator<testing::TestProperty>>>,testing::internal::TestPropertyKeyIs>
                      (_Var2,__last,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string(local_60);
    if (_Var2._M_current ==
        (this->test_properties_).
        super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::push_back
                (&this->test_properties_,test_property);
    }
    else {
      std::__cxx11::string::string(local_60,(test_property->value_)._M_dataplus._M_p,&local_69);
      std::__cxx11::string::_M_assign((string *)&(_Var2._M_current)->value_);
      std::__cxx11::string::~string(local_60);
    }
    internal::GTestMutexLock::~GTestMutexLock(&local_68);
  }
  return;
}

Assistant:

void TestResult::RecordProperty(const std::string& xml_element,
                                const TestProperty& test_property) {
  if (!ValidateTestProperty(xml_element, test_property)) {
    return;
  }
  internal::MutexLock lock(&test_properites_mutex_);
  const std::vector<TestProperty>::iterator property_with_matching_key =
      std::find_if(test_properties_.begin(), test_properties_.end(),
                   internal::TestPropertyKeyIs(test_property.key()));
  if (property_with_matching_key == test_properties_.end()) {
    test_properties_.push_back(test_property);
    return;
  }
  property_with_matching_key->SetValue(test_property.value());
}